

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void compact_int64_suite::fail_array16_int64_missing_one(void)

{
  value_type input [10];
  decoder decoder;
  undefined4 local_48;
  value local_44;
  uchar local_40 [16];
  decoder local_30;
  
  local_40[0] = 0xbe;
  local_40[1] = '\b';
  local_40[2] = '\0';
  local_40[3] = '\x11';
  local_40[4] = '\"';
  local_40[5] = '3';
  local_40[6] = 'D';
  local_40[7] = 'U';
  local_40[8] = 'f';
  local_40[9] = 'w';
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[10]>
            (&local_30,(uchar (*) [10])local_40);
  local_44 = local_30.current.code;
  local_48 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xb18,"void compact_int64_suite::fail_array16_int64_missing_one()",&local_44,&local_48
            );
  return;
}

Assistant:

void fail_array16_int64_missing_one()
{
    const value_type input[] = { token::code::array16_int64, 0x08, 0x00, 0x11, 0x22, 0x33, 0x44, 0x55, 0x66, 0x77 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}